

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::InternalMergeFromSmallToEmpty
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  KeyValue *dst_it;
  size_t count;
  LogMessage local_60;
  Voidify local_4d [20];
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  ExtensionSet *local_20;
  ExtensionSet *other_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  local_20 = other;
  other_local = (ExtensionSet *)extendee;
  extendee_local = (MessageLite *)this;
  bVar1 = is_large(other);
  local_39 = 0;
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x3ea,"!other.is_large()");
    local_39 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  if ((short)this->flat_size_ < 0) {
    __assert_fail("static_cast<int16_t>(flat_size_) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                  ,0x3ec,
                  "void google::protobuf::internal::ExtensionSet::InternalMergeFromSmallToEmpty(const MessageLite *, const ExtensionSet &)"
                 );
  }
  bVar1 = IsCompletelyEmpty(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x3ed,"IsCompletelyEmpty()");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_4d,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_60);
  }
  iVar2 = NumExtensions(local_20);
  if ((long)iVar2 != 0) {
    InternalReserveSmallCapacityFromEmpty(this,(long)iVar2);
    this->flat_size_ = (uint16_t)iVar2;
    ForEach<google::protobuf::internal::ExtensionSet::InternalMergeFromSmallToEmpty(google::protobuf::MessageLite_const*,google::protobuf::internal::ExtensionSet_const&)::__0,google::protobuf::internal::ExtensionSet::Prefetch>
              (local_20);
  }
  return;
}

Assistant:

void ExtensionSet::InternalMergeFromSmallToEmpty(const MessageLite* extendee,
                                                 const ExtensionSet& other) {
  ABSL_DCHECK(!other.is_large());
  // Compiler is complaining on potential side effects for `!other.is_large()`.
  ABSL_ASSUME(static_cast<int16_t>(flat_size_) >= 0);
  ABSL_DCHECK(IsCompletelyEmpty());

  size_t count = other.NumExtensions();
  if (count == 0) {
    return;
  }

  InternalReserveSmallCapacityFromEmpty(count);
  flat_size_ = static_cast<uint16_t>(count);
  auto dst_it = map_.flat;
  other.ForEach(
      [extendee, this, &dst_it, &other](int number, const Extension& ext) {
        if (ext.is_cleared) {
          return;
        }
        dst_it->first = number;
        this->InternalExtensionMergeFromIntoUninitializedExtension(
            dst_it->second, extendee, number, ext, other.arena_);
        ++dst_it;
      },
      Prefetch{});
}